

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrixT.h
# Opt level: O2

int __thiscall TPZStructMatrixT<double>::ClassId(TPZStructMatrixT<double> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZStructMatrixT",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = ::TPZStructMatrix::ClassId(&this->super_TPZStructMatrix);
  iVar3 = ClassIdOrHash<double>();
  std::__cxx11::string::~string((string *)&local_38);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int ClassId() const override{
        return Hash("TPZStructMatrixT") ^
            TPZStructMatrix::ClassId() << 1 ^
            ClassIdOrHash<TVar>() << 2;
    }